

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pointer __thiscall
pstore::json::parser<pstore::json::null_output>::
make_terminal_matcher<pstore::json::details::string_matcher<pstore::json::null_output>,std::__cxx11::string*,bool_const&>
          (parser<pstore::json::null_output> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args,bool *args_1)

{
  pointer psVar1;
  byte *in_RCX;
  _Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false> extraout_RDX;
  pointer pVar2;
  deleter<pstore::json::details::matcher<pstore::json::null_output>_> local_31;
  not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_30;
  byte *local_28;
  bool *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args_local;
  parser<pstore::json::null_output> *this_local;
  
  local_28 = in_RCX;
  args_local_1 = args_1;
  args_local = args;
  this_local = this;
  psVar1 = std::
           unique_ptr<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
           ::operator->((unique_ptr<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                         *)args);
  pstore::gsl::
  not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
  not_null(&local_30,
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)args_local_1);
  json::details::string_matcher<pstore::json::null_output>::string_matcher
            ((string_matcher<pstore::json::null_output> *)&(psVar1->terminal).__align,local_30,
             (bool)(*local_28 & 1));
  json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>::deleter
            (&local_31,false);
  std::
  unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>>>
  ::
  unique_ptr<pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>>,void>
            ((unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>>>
              *)this,(pointer)&(psVar1->terminal).__align,&local_31);
  pVar2._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
  _M_head_impl = extraout_RDX._M_head_impl;
  pVar2._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._0_8_ = this;
  return (pointer)pVar2._M_t.
                  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ;
}

Assistant:

auto parser<Callbacks>::make_terminal_matcher (Args &&... args) -> pointer {
            static_assert (sizeof (Matcher) <= sizeof (decltype (singletons_->terminal)),
                           "terminal storage is not large enough for Matcher type");
            static_assert (alignof (Matcher) <= alignof (decltype (singletons_->terminal)),
                           "terminal storage is not sufficiently aligned for Matcher type");

            return pointer (new (&singletons_->terminal) Matcher (std::forward<Args> (args)...),
                            typename pointer::deleter_type{false});
        }